

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O2

void __thiscall sf::Text::setFillColor(Text *this,Color *color)

{
  VertexArray *this_00;
  bool bVar1;
  size_t sVar2;
  Vertex *pVVar3;
  size_t sVar4;
  VertexBuffer *this_01;
  size_t i;
  ulong index;
  
  bVar1 = operator!=(color,&this->m_fillColor);
  if ((bVar1) && (this->m_fillColor = *color, this->m_geometryNeedUpdate == false)) {
    this_00 = &this->m_vertices;
    index = 0;
    while( true ) {
      sVar2 = VertexArray::getVertexCount(this_00);
      if (sVar2 <= index) break;
      pVVar3 = VertexArray::operator[](this_00,index);
      pVVar3->color = this->m_fillColor;
      index = index + 1;
    }
    bVar1 = VertexBuffer::isAvailable();
    if (bVar1) {
      this_01 = &this->m_verticesBuffer;
      sVar2 = VertexBuffer::getVertexCount(this_01);
      sVar4 = VertexArray::getVertexCount(this_00);
      if (sVar2 != sVar4) {
        sVar2 = VertexArray::getVertexCount(this_00);
        VertexBuffer::create(this_01,sVar2);
      }
      sVar2 = VertexArray::getVertexCount(this_00);
      if (sVar2 != 0) {
        pVVar3 = VertexArray::operator[](this_00,0);
        VertexBuffer::update(this_01,pVVar3);
        return;
      }
    }
  }
  return;
}

Assistant:

void Text::setFillColor(const Color& color)
{
    if (color != m_fillColor)
    {
        m_fillColor = color;

        // Change vertex colors directly, no need to update whole geometry
        // (if geometry is updated anyway, we can skip this step)
        if (!m_geometryNeedUpdate)
        {
            for (std::size_t i = 0; i < m_vertices.getVertexCount(); ++i)
                m_vertices[i].color = m_fillColor;

            if (VertexBuffer::isAvailable())
            {
                if (m_verticesBuffer.getVertexCount() != m_vertices.getVertexCount())
                    m_verticesBuffer.create(m_vertices.getVertexCount());

                if (m_vertices.getVertexCount() > 0)
                    m_verticesBuffer.update(&m_vertices[0]);
            }
        }
    }
}